

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

_Bool sysbvm_tuple_equals(sysbvm_context_t *context,sysbvm_tuple_t a,sysbvm_tuple_t b)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t local_20;
  
  sVar1 = sysbvm_tuple_getType(context,a);
  if ((sVar1 != 0) && (sVar1 = sysbvm_type_getEqualsFunction(context,sVar1), sVar1 != 0)) {
    local_28 = a;
    local_20 = b;
    sVar1 = sysbvm_function_apply(context,sVar1,2,&local_28,0);
    return sVar1 == 0x1f;
  }
  return a == b;
}

Assistant:

SYSBVM_API bool sysbvm_tuple_equals(sysbvm_context_t *context, sysbvm_tuple_t a, sysbvm_tuple_t b)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, a);
    if(type)
    {
        sysbvm_tuple_t equalsFunction = sysbvm_type_getEqualsFunction(context, type);
        if(equalsFunction)
            return sysbvm_tuple_boolean_decode(sysbvm_function_apply2(context, equalsFunction, a, b));
    }

    return sysbvm_tuple_identityEquals(a, b);
}